

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O0

void generateDatasetImages
               (string *plate_path,string *backgr_path,string *output_folder,int image_size,
               double plate_scale,int nwarps)

{
  result_type_conflict2 rVar1;
  bool bVar2;
  result_type_conflict1 rVar3;
  ostream *poVar4;
  int local_2e34;
  vector<int,_std::allocator<int>_> local_2df8;
  _InputArray local_2dd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2dc0;
  Point_<int> local_2da0;
  Size_<int> local_2d98;
  _OutputArray local_2d90;
  _InputArray local_2d78;
  Size_<int> local_2d60;
  _OutputArray local_2d58;
  _InputArray local_2d40;
  double local_2d28;
  double yolo_h;
  double yolo_w;
  double yolo_y;
  double yolo_x;
  int hight;
  int width;
  int y;
  int x;
  double scale;
  Mat resbg;
  Mat local_2c90 [8];
  Mat resplt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c30;
  string local_2c10 [32];
  undefined1 local_2bf0 [8];
  Mat back;
  ostream local_2b90 [8];
  ofstream file;
  string local_2990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2970;
  undefined1 local_2950 [8];
  string name;
  Mat *plt;
  iterator __end1;
  iterator __begin1;
  list<cv::Mat,_std::allocator<cv::Mat>_> *__range1;
  undefined1 local_28b0 [8];
  list<cv::Mat,_std::allocator<cv::Mat>_> wrps;
  _OutputArray local_2890;
  _InputArray local_2878;
  int local_285c;
  Mat local_2858 [4];
  int ksize;
  Mat blured;
  string local_27f8 [8];
  Mat plate;
  undefined1 local_2798 [8];
  uniform_real_distribution<double> realgen;
  uniform_int_distribution<int> intgen;
  mt19937 gen;
  random_device rd;
  path local_60;
  int local_34;
  double dStack_30;
  int nwarps_local;
  double plate_scale_local;
  string *psStack_20;
  int image_size_local;
  string *output_folder_local;
  string *backgr_path_local;
  string *plate_path_local;
  
  local_34 = nwarps;
  dStack_30 = plate_scale;
  plate_scale_local._4_4_ = image_size;
  psStack_20 = output_folder;
  output_folder_local = backgr_path;
  backgr_path_local = plate_path;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_60,output_folder,auto_format);
  std::filesystem::create_directory(&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::random_device::random_device((random_device *)&gen._M_p);
  rVar3 = std::random_device::operator()((random_device *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&intgen,(ulong)rVar3);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&realgen._M_param._M_b,1,
             (int)((double)plate_scale_local._4_4_ - dStack_30 * (double)plate_scale_local._4_4_));
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_2798,0.8,1.0);
  cv::imread(local_27f8,(int)plate_path);
  cv::Mat::Mat(local_2858);
  if ((int)((long)((ulong)(uint)((int)((long)_plate / 2) >> 0x1f) << 0x20 |
                  (long)_plate / 2 & 0xffffffffU) % 2) == 0) {
    local_2e34 = _plate / 2 + 1;
  }
  else {
    local_2e34 = _plate / 2;
  }
  local_285c = local_2e34;
  cv::_InputArray::_InputArray(&local_2878,(Mat *)local_27f8);
  cv::_OutputArray::_OutputArray(&local_2890,local_2858);
  cv::Size_<int>::Size_
            ((Size_<int> *)
             &wrps.super__List_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl._M_node._M_size,
             local_285c,local_285c);
  cv::GaussianBlur(0,0,&local_2878,&local_2890,
                   &wrps.super__List_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl._M_node._M_size
                   ,4);
  cv::_OutputArray::~_OutputArray(&local_2890);
  cv::_InputArray::~_InputArray(&local_2878);
  cv::Mat::Mat((Mat *)&__range1,local_2858);
  randomWarps_abi_cxx11_
            ((list<cv::Mat,_std::allocator<cv::Mat>_> *)local_28b0,(Mat *)&__range1,local_34);
  cv::Mat::~Mat((Mat *)&__range1);
  __end1 = std::__cxx11::list<cv::Mat,_std::allocator<cv::Mat>_>::begin
                     ((list<cv::Mat,_std::allocator<cv::Mat>_> *)local_28b0);
  plt = (Mat *)std::__cxx11::list<cv::Mat,_std::allocator<cv::Mat>_>::end
                         ((list<cv::Mat,_std::allocator<cv::Mat>_> *)local_28b0);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&plt);
    if (!bVar2) break;
    name.field_2._8_8_ = std::_List_iterator<cv::Mat>::operator*(&__end1);
    generateDatasetImages::imagenum = generateDatasetImages::imagenum + 1;
    std::operator+(&local_2970,output_folder,"/");
    std::__cxx11::to_string(&local_2990,generateDatasetImages::imagenum);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2950,
                   &local_2970,&local_2990);
    std::__cxx11::string::~string((string *)&local_2990);
    std::__cxx11::string::~string((string *)&local_2970);
    std::ofstream::ofstream(local_2b90);
    std::__cxx11::string::string(local_2c10,(string *)backgr_path);
    loadRandomImage((string *)local_2bf0);
    std::__cxx11::string::~string(local_2c10);
    std::operator+(&local_2c30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2950,
                   ".txt");
    std::ofstream::open(local_2b90,&local_2c30,0x10);
    std::__cxx11::string::~string((string *)&local_2c30);
    cv::Mat::Mat(local_2c90);
    cv::Mat::Mat((Mat *)&scale);
    rVar3 = std::random_device::operator()((random_device *)&gen._M_p);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&intgen,(ulong)rVar3);
    rVar1 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_2798,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&intgen);
    _y = (rVar1 * dStack_30 * (double)plate_scale_local._4_4_) /
         (double)*(int *)(name.field_2._8_8_ + 0xc);
    width = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&realgen._M_param._M_b,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&intgen);
    hight = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&realgen._M_param._M_b,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&intgen);
    yolo_x._4_4_ = (int)(_y * (double)*(int *)(name.field_2._8_8_ + 0xc));
    yolo_x._0_4_ = (int)(_y * (double)*(int *)(name.field_2._8_8_ + 8));
    yolo_y = (double)(width + yolo_x._4_4_ / 2) / (double)plate_scale_local._4_4_;
    yolo_w = (double)(hight + yolo_x._0_4_ / 2) / (double)plate_scale_local._4_4_;
    yolo_h = (double)yolo_x._4_4_ / (double)plate_scale_local._4_4_;
    local_2d28 = (double)yolo_x._0_4_ / (double)plate_scale_local._4_4_;
    poVar4 = std::operator<<(local_2b90,"1 ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,yolo_y);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,yolo_w);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,yolo_h);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2d28);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ofstream::close();
    cv::_InputArray::_InputArray(&local_2d40,(Mat *)local_2bf0);
    cv::_OutputArray::_OutputArray(&local_2d58,(Mat *)&scale);
    cv::Size_<int>::Size_(&local_2d60,plate_scale_local._4_4_,plate_scale_local._4_4_);
    cv::resize(0,&local_2d40,&local_2d58,&local_2d60,1);
    cv::_OutputArray::~_OutputArray(&local_2d58);
    cv::_InputArray::~_InputArray(&local_2d40);
    poVar4 = std::operator<<((ostream *)&std::cout,"back");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    cv::_InputArray::_InputArray(&local_2d78,(Mat *)name.field_2._8_8_);
    cv::_OutputArray::_OutputArray(&local_2d90,local_2c90);
    cv::Size_<int>::Size_
              (&local_2d98,(int)(_y * (double)*(int *)(name.field_2._8_8_ + 0xc)),
               (int)(_y * (double)*(int *)(name.field_2._8_8_ + 8)));
    cv::resize(0,&local_2d78,&local_2d90,&local_2d98,1);
    cv::_OutputArray::~_OutputArray(&local_2d90);
    cv::_InputArray::~_InputArray(&local_2d78);
    poVar4 = std::operator<<((ostream *)&std::cout,"front");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    cv::Point_<int>::Point_(&local_2da0,width,hight);
    overlayImage((Mat *)&scale,local_2c90,&local_2da0);
    std::operator+(&local_2dc0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2950,
                   ".png");
    cv::_InputArray::_InputArray(&local_2dd8,(Mat *)&scale);
    local_2df8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2df8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2df8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_2df8);
    cv::imwrite((string *)&local_2dc0,&local_2dd8,(vector *)&local_2df8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_2df8);
    cv::_InputArray::~_InputArray(&local_2dd8);
    std::__cxx11::string::~string((string *)&local_2dc0);
    cv::Mat::~Mat((Mat *)&scale);
    cv::Mat::~Mat(local_2c90);
    cv::Mat::~Mat((Mat *)local_2bf0);
    std::ofstream::~ofstream(local_2b90);
    std::__cxx11::string::~string((string *)local_2950);
    std::_List_iterator<cv::Mat>::operator++(&__end1);
  }
  std::__cxx11::list<cv::Mat,_std::allocator<cv::Mat>_>::~list
            ((list<cv::Mat,_std::allocator<cv::Mat>_> *)local_28b0);
  cv::Mat::~Mat(local_2858);
  cv::Mat::~Mat((Mat *)local_27f8);
  std::random_device::~random_device((random_device *)&gen._M_p);
  return;
}

Assistant:

void generateDatasetImages(string plate_path, string backgr_path, string output_folder, int image_size, double plate_scale, int nwarps){
    static int imagenum;

    filesystem::create_directory(output_folder);
    
    random_device rd;  //Will be used to obtain a seed for the random number engine
    mt19937 gen(rd());
    uniform_int_distribution<> intgen(1, image_size-plate_scale*image_size);
    uniform_real_distribution<> realgen(0.8, 1);
    auto plate = cv::imread(plate_path, cv::IMREAD_UNCHANGED);
    cv::Mat blured;
    int ksize = (plate.rows/2)%2==0 ? plate.rows/2+1 : plate.rows/2;
    cv::GaussianBlur(plate, blured, cv::Size(ksize,ksize), cv::BORDER_DEFAULT);
    auto wrps = randomWarps(blured, nwarps);

    for (auto& plt: wrps) {
        imagenum++;
        string name = output_folder+"/" + to_string(imagenum);
        ofstream file;
        auto back = loadRandomImage(backgr_path);
        file.open(name + ".txt");
        cv::Mat resplt,resbg;
        gen.seed(rd());
        auto scale = realgen(gen)*plate_scale*image_size/plt.cols;
        int x = intgen(gen);
        int y =  intgen(gen);
        int width = scale*plt.cols;
        int hight = scale*plt.rows;
        double yolo_x = double(x+width/2)/image_size;
        double yolo_y = double(y+hight/2)/image_size;
        double yolo_w = double(width)/image_size;
        double yolo_h = double(hight)/image_size;
        file <<"1 "<<yolo_x<<" "<<yolo_y<<" "<<yolo_w<<" "<<yolo_h<<endl;
        file.close();
        cv::resize(back, resbg, cv::Size(image_size,image_size));
        cout<<"back"<<endl;
        cv::resize(plt, resplt, cv::Size(scale*plt.cols, scale*plt.rows));
        cout<<"front"<<endl;
        overlayImage(resbg, resplt, cv::Point(x,y));
        cv::imwrite(name + ".png", resbg);
    }
}